

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

void __thiscall gutil::Parameter::printHelp(Parameter *this,ostream *out,size_t columns)

{
  char *pcVar1;
  string *psVar2;
  ostream *poVar3;
  size_type sVar4;
  pointer pbVar5;
  ulong uVar6;
  pointer pbVar7;
  ulong uVar8;
  long lVar9;
  _Alloc_hider _Var10;
  ulong uVar11;
  string descr;
  string val;
  string val_1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  sVar4 = (this->creat)._M_string_length;
  if (sVar4 != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(this->creat)._M_dataplus._M_p,sVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  pbVar5 = (this->def).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (this->def).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 == pbVar5) {
    uVar8 = 1;
  }
  else {
    lVar9 = 0;
    uVar11 = 0;
    uVar8 = 0;
    do {
      anon_unknown_4::getValue
                (&local_b0,*(anon_unknown_4 **)((long)&(pbVar5->_M_dataplus)._M_p + lVar9),
                 *(string **)((long)&pbVar5->_M_string_length + lVar9));
      pcVar1 = (char *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_);
      if (local_b0._M_string_length == 0) {
        sVar4 = 0;
      }
      else {
        sVar4 = local_b0._M_string_length;
        if (*pcVar1 == '<') {
          sVar4 = local_b0._M_string_length +
                  (**(char **)((long)&(((this->def).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar9) == ' ');
        }
      }
      if (uVar8 <= sVar4) {
        uVar8 = sVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &local_b0.field_2) {
        operator_delete(pcVar1);
      }
      uVar11 = uVar11 + 1;
      pbVar5 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar7 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = lVar9 + 0x20;
    } while (uVar11 < (ulong)((long)pbVar7 - (long)pbVar5 >> 5));
    uVar8 = uVar8 + 1;
  }
  uVar11 = columns >> 1;
  if (uVar8 < columns >> 1) {
    uVar11 = uVar8;
  }
  if (pbVar7 != pbVar5) {
    uVar8 = 0;
    do {
      anon_unknown_4::getValue
                (&local_90,(anon_unknown_4 *)pbVar5[uVar8]._M_dataplus._M_p,
                 (string *)pbVar5[uVar8]._M_string_length);
      pbVar7 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = pbVar7 + uVar8;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      uVar6 = std::__cxx11::string::find((char)pbVar5,0x23);
      if (uVar6 < pbVar7[uVar8]._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)pbVar5);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_) !=
            &local_b0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_b0._M_dataplus._M_p._1_7_,local_b0._M_dataplus._M_p._0_1_))
          ;
        }
      }
      trim(&local_d0);
      if (local_90._M_string_length == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
        anon_unknown_4::printDescription(out,&local_50,0,columns);
        psVar2 = &local_50;
        _Var10._M_p = local_50._M_dataplus._M_p;
      }
      else {
        if ((*local_90._M_dataplus._M_p == '-') ||
           (*(this->def).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p != ' ')) {
          lVar9 = 0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"  ",2);
          lVar9 = 2;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,local_90._M_dataplus._M_p,local_90._M_string_length);
        uVar6 = lVar9 + local_90._M_string_length;
        if (uVar6 < uVar11) {
          do {
            local_b0._M_dataplus._M_p._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar11);
        }
        else if (uVar11 < uVar6) {
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
          std::ostream::put((char)out);
          std::ostream::flush();
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
        anon_unknown_4::printDescription(out,&local_70,uVar11,columns);
        psVar2 = &local_70;
        _Var10._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != &psVar2->field_2) {
        operator_delete(_Var10._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      uVar8 = uVar8 + 1;
      pbVar5 = (this->def).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->def).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5));
  }
  return;
}

Assistant:

void Parameter::printHelp(std::ostream &out, size_t columns)
const
{
  size_t col1=0;

  if (creat.size() > 0)
  {
    out << creat << std::endl;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    size_t n=val.size();

    if (n > 0 && val[0] == '<' && def[i][0] == ' ')
    {
      n++;
    }

    col1=std::max(col1, n);
  }

  col1++;

  if (col1 > columns/2)
  {
    col1=columns/2;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    std::string descr=getDescription(def[i]);

    if (val.size() > 0)
    {
      size_t n=0;

      if (val[0] != '-' && def[i][0] == ' ')
      {
        out << "  ";
        n+=2;
      }

      out << val;
      n+=val.length();

      while (n < col1)
      {
        out << ' ';
        n++;
      }

      if (n > col1)
      {
        out << std::endl;
        n=0;
      }

      printDescription(out, descr, col1, columns);
    }
    else
    {
      printDescription(out, descr, 0, columns);
    }
  }
}